

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_mame.c
# Opt level: O2

void saa1099m_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  byte *pbVar1;
  int iVar2;
  undefined1 *puVar3;
  uint uVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  int ch;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  int local_58;
  int local_54;
  
  if (*(char *)((long)param + 0x16) == '\0') {
    memset(*outputs,0,(ulong)samples << 2);
    memset(outputs[1],0,(ulong)samples << 2);
    return;
  }
  puVar3 = (undefined1 *)((long)param + 8);
  pdVar5 = (double *)((long)param + 0x118);
  lVar6 = 0x38;
  do {
    if (lVar6 == 0x128) {
      iVar2 = (*(int *)((long)param + 0x148) + 0x80) / 0x100;
      uVar8 = 0;
      do {
        if (uVar8 == samples) {
          return;
        }
        local_58 = 0;
        local_54 = 0;
        for (uVar9 = 0; uVar9 != 6; uVar9 = uVar9 + 1) {
          pbVar1 = (byte *)((long)param + uVar9 * 0x28 + 0x20);
          dVar10 = *(double *)((long)param + uVar9 * 0x28 + 0x38);
          if ((dVar10 == 0.0) && (!NAN(dVar10))) {
            dVar10 = (double)(iVar2 << (pbVar1[3] & 0x1f)) / (double)(*pbVar1 ^ 0x1ff);
            *(double *)(pbVar1 + 0x18) = dVar10;
          }
          dVar10 = *(double *)(pbVar1 + 0x10) - dVar10;
          *(double *)(pbVar1 + 0x10) = dVar10;
          while (dVar10 < 0.0) {
            *(double *)(pbVar1 + 0x18) =
                 (double)(iVar2 << (pbVar1[3] & 0x1f)) / (511.0 - (double)*pbVar1);
            *(double *)(pbVar1 + 0x10) = dVar10 + *(double *)((long)param + 0x140);
            pbVar1[0x20] = pbVar1[0x20] ^ 1;
            if ((int)uVar9 == 4) {
              ch = 1;
              if (*(char *)((long)param + 0x13) == '\0') goto LAB_00161492;
            }
            else if (((int)uVar9 == 1) && (*(char *)((long)param + 0x12) == '\0')) {
              ch = 0;
LAB_00161492:
              saa1099_envelope_w((saa1099_state *)param,ch);
            }
            dVar10 = *(double *)(pbVar1 + 0x10);
          }
          if (pbVar1[0x21] == 0) {
            if (pbVar1[2] == 0) {
              uVar4 = 0;
            }
            else {
              uVar4 = -(uint)((*(byte *)((long)param + ((uVar9 & 0xffffffff) / 3) * 0x18 + 0x120) &
                              1) == 0) | 1;
            }
            if (pbVar1[1] != 0) {
              uVar4 = uVar4 + (-(uint)((pbVar1[0x20] & 1) == 0) | 1);
            }
            local_58 = local_58 + (int)((uint)pbVar1[0xc] * *(int *)(pbVar1 + 4) * uVar4) / 0x20;
            local_54 = local_54 + (int)((uint)pbVar1[0xd] * uVar4 * *(int *)(pbVar1 + 8)) / 0x20;
          }
        }
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          lVar7 = lVar6 * 0x18;
          pdVar5 = (double *)((long)param + lVar7 + 0x110);
          dVar10 = *(double *)((long)param + lVar7 + 0x110) -
                   *(double *)((long)param + lVar7 + 0x118);
          *(double *)((long)param + lVar7 + 0x110) = dVar10;
          while (dVar10 < 0.0) {
            dVar10 = dVar10 + *(double *)((long)param + 0x140);
            *pdVar5 = dVar10;
            uVar4 = *(uint *)(pdVar5 + 2);
            *(uint *)(pdVar5 + 2) = ((uVar4 >> 10 ^ uVar4 >> 0x11) & 1) + uVar4 * 2;
          }
        }
        (*outputs)[uVar8] = local_58 / 6;
        outputs[1][uVar8] = local_54 / 6;
        uVar8 = uVar8 + 1;
      } while( true );
    }
    switch(*puVar3) {
    case 0:
      dVar10 = (double)*(int *)((long)param + 0x148) * 0.00390625;
      break;
    case 1:
      dVar10 = (double)*(int *)((long)param + 0x148) * 0.001953125;
      break;
    case 2:
      dVar10 = (double)*(int *)((long)param + 0x148) * 0.0009765625;
      break;
    case 3:
      dVar10 = *(double *)((long)param + lVar6);
      goto LAB_0016137d;
    default:
      goto switchD_00161343_default;
    }
    dVar10 = dVar10 + dVar10;
LAB_0016137d:
    *pdVar5 = dVar10;
switchD_00161343_default:
    pdVar5 = pdVar5 + 3;
    lVar6 = lVar6 + 0x78;
    puVar3 = puVar3 + 1;
  } while( true );
}

Assistant:

static void saa1099m_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	saa1099_state *saa = (saa1099_state *)param;
	UINT32 j, ch;
	INT32 clk2div512;

	/* if the channels are disabled we're done */
	if (!saa->all_ch_enable)
	{
		/* init output data */
		memset(outputs[LEFT],0,samples*sizeof(*outputs[LEFT]));
		memset(outputs[RIGHT],0,samples*sizeof(*outputs[RIGHT]));
		return;
	}

	for (ch = 0; ch < 2; ch++)
	{
		switch (saa->noise_params[ch])
		{
		case 0: saa->noise[ch].freq = saa->master_clock/ 256.0 * 2; break;
		case 1: saa->noise[ch].freq = saa->master_clock/ 512.0 * 2; break;
		case 2: saa->noise[ch].freq = saa->master_clock/1024.0 * 2; break;
		case 3: saa->noise[ch].freq = saa->channels[ch * 3].freq;   break; // todo: this case will be m_master_clock/[ch*3's octave divisor, 0 is = 256*2, higher numbers are higher] * 2 if the tone generator phase reset bit (0x1c bit 1) is set.
		}
	}

	// clock fix thanks to http://www.vogons.org/viewtopic.php?p=344227#p344227
	//clk2div512 = 2 * saa->master_clock / 512;
	clk2div512 = (saa->master_clock + 128) / 256;
	
	/* fill all data needed */
	for( j = 0; j < samples; j++ )
	{
		DEV_SMPL output_l = 0, output_r = 0;

		/* for each channel */
		for (ch = 0; ch < 6; ch++)
		{
			struct saa1099_channel* saach = &saa->channels[ch];
			int outlvl;

			if (saach->freq == 0.0)
				saach->freq = (double)(clk2div512 << saach->octave) /
					(double)(511 - saach->frequency);

			/* check the actual position in the square wave */
			saach->counter -= saach->freq;
			while (saach->counter < 0)
			{
				/* calculate new frequency now after the half wave is updated */
				saach->freq = (double)(clk2div512 << saach->octave) /
					(double)(511.0 - saach->frequency);

				saach->counter += saa->sample_rate;
				saach->level ^= 1;

				/* eventually clock the envelope counters */
				if (ch == 1 && saa->env_clock[0] == 0)
					saa1099_envelope_w(saa, 0);
				else if (ch == 4 && saa->env_clock[1] == 0)
					saa1099_envelope_w(saa, 1);
			}

			if (saach->Muted)
				continue;	// placed here to ensure that envelopes are updated
			
#if 0
			// if the noise is enabled
			if (saach->noise_enable)
			{
				// if the noise level is high (noise 0: chan 0-2, noise 1: chan 3-5)
				if (saa->noise[ch/3].level & 1)
				{
					// subtract to avoid overflows, also use only half amplitude
					output_l -= saach->amplitude[ LEFT] * saach->envelope[ LEFT] / 16;
					output_r -= saach->amplitude[RIGHT] * saach->envelope[RIGHT] / 16;
				}
			}
			// if the square wave is enabled
			if (saach->freq_enable)
			{
				// if the channel level is high
				if (saach->level & 1)
				{
					output_l += saach->amplitude[ LEFT] * saach->envelope[ LEFT] / 16;
					output_r += saach->amplitude[RIGHT] * saach->envelope[RIGHT] / 16;
				}
			}
#else
			// Now with bipolar output. -Valley Bell
			outlvl = 0;
			if (saach->noise_enable)
				outlvl += (saa->noise[ch/3].level & 1) ? +1 : -1;
			if (saach->freq_enable)
				outlvl += (saach->level & 1) ? +1 : -1;
			output_l += outlvl * saach->amplitude[ LEFT] * saach->envelope[ LEFT] / 32;
			output_r += outlvl * saach->amplitude[RIGHT] * saach->envelope[RIGHT] / 32;
#endif
		}

		for (ch = 0; ch < 2; ch++)
		{
			/* update the state of the noise generator
			 * polynomial is x^18 + x^11 + x (i.e. 0x20400) and is a plain XOR, initial state is probably all 1s
			 * see http://www.vogons.org/viewtopic.php?f=9&t=51695 */
			saa->noise[ch].counter -= saa->noise[ch].freq;
			while (saa->noise[ch].counter < 0)
			{
				saa->noise[ch].counter += saa->sample_rate;
				if( ((saa->noise[ch].level & 0x20000) == 0) != ((saa->noise[ch].level & 0x0400) == 0) )
					saa->noise[ch].level = (saa->noise[ch].level << 1) | 1;
				else
					saa->noise[ch].level <<= 1;
			}
		}
		/* write sound data to the buffer */
		outputs[LEFT][j] = output_l / 6;
		outputs[RIGHT][j] = output_r / 6;
	}
}